

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-parsing-utils.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  char cVar2;
  float fVar3;
  char *__s2;
  long lVar4;
  byte bVar5;
  _Bool _Var6;
  uchar uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  double dVar12;
  undefined8 local_38;
  double local_30;
  
  GREATEST_INIT();
  bVar5 = greatest_info.flags;
  uVar7 = greatest_info.verbosity;
  for (iVar8 = 1; iVar8 < argc; iVar8 = iVar8 + 1) {
    __s2 = argv[iVar8];
    if (*__s2 == '-') {
      bVar1 = __s2[1];
      switch(bVar1) {
      case 0x65:
        greatest_info.exact_name_match = '\x01';
        break;
      case 0x66:
        bVar5 = bVar5 | 1;
        greatest_info.flags = bVar5;
        break;
      case 0x67:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6d:
      case 0x6e:
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x75:
      case 0x77:
switchD_00102d11_caseD_67:
        iVar8 = strncmp("--help",__s2,6);
        if (iVar8 == 0) {
switchD_00102d11_caseD_68:
          greatest_usage(*argv);
          exit(0);
        }
        uVar11 = bVar1 - 0x2d;
        if (uVar11 == 0) {
          uVar11 = (uint)(byte)__s2[2];
        }
        if (uVar11 != 0) {
          fprintf(_stdout,"Unknown argument \'%s\'\n",__s2);
LAB_00103300:
          greatest_usage(*argv);
          exit(1);
        }
        goto LAB_00102dc3;
      case 0x68:
        goto switchD_00102d11_caseD_68;
      case 0x6c:
        bVar5 = bVar5 | 2;
        greatest_info.flags = bVar5;
        break;
      case 0x73:
      case 0x74:
      case 0x78:
        iVar9 = iVar8 + 1;
        if (argc <= iVar9) goto LAB_00103300;
        if (5 < bVar1 - 0x73) goto switchD_00102d11_caseD_67;
        switch((uint)bVar1) {
        case 0x73:
          greatest_info.suite_filter = argv[iVar9];
          iVar8 = iVar9;
          break;
        case 0x74:
          greatest_info.test_filter = argv[iVar9];
          iVar8 = iVar9;
          break;
        default:
          goto switchD_00102d11_caseD_67;
        case 0x76:
          goto switchD_00102d11_caseD_76;
        case 0x78:
          greatest_info.test_exclude = argv[iVar9];
          iVar8 = iVar9;
        }
        break;
      case 0x76:
switchD_00102d11_caseD_76:
        uVar7 = uVar7 + '\x01';
        greatest_info.verbosity = uVar7;
        break;
      default:
        if (bVar1 != 0x61) goto switchD_00102d11_caseD_67;
        bVar5 = bVar5 | 4;
        greatest_info.flags = bVar5;
      }
    }
  }
LAB_00102dc3:
  iVar8 = greatest_test_pre("parsing_int32");
  if (iVar8 == 1) {
    for (lVar10 = 0xc; lVar10 != 0x1ac; lVar10 = lVar10 + 0x10) {
      fVar3 = *(float *)((long)&__do_global_dtors_aux_fini_array_entry + lVar10 + 4);
      _Var6 = str_to_int32(*(char **)((long)&__frame_dummy_init_array_entry + lVar10 + 4),
                           (int32_t *)&local_38);
      if ((_Bool)*(char *)((long)&parsing_int32_i32_tests + lVar10) != _Var6) {
        greatest_info.fail_line = 0x5f;
        greatest_info.msg = "i32_tests[i].expect_success != success";
        greatest_info.assertions = greatest_info.assertions + 1;
LAB_00102e7a:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parsing-utils.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_001032e0;
        iVar8 = -1;
        goto LAB_00102e91;
      }
      uVar11 = greatest_info.assertions + 1;
      if ((_Var6) && (uVar11 = greatest_info.assertions + 2, fVar3 != (float)local_38)) {
        greatest_info.fail_line = 0x61;
        greatest_info.msg = "expected != obtained";
        greatest_info.assertions = greatest_info.assertions + 2;
        goto LAB_00102e7a;
      }
      greatest_info.assertions = uVar11;
    }
    greatest_info.msg = (char *)0x0;
    iVar8 = 0;
LAB_00102e91:
    greatest_test_post(iVar8);
  }
  iVar8 = greatest_test_pre("parsing_float");
  if (iVar8 == 1) {
    for (lVar10 = 0xc; lVar10 != 0x37c; lVar10 = lVar10 + 0x10) {
      local_30 = (double)CONCAT44(local_30._4_4_,*(undefined4 *)(&UNK_0010616c + lVar10));
      _Var6 = str_to_float(*(char **)(&UNK_00106164 + lVar10),(float *)&local_38);
      if ((_Bool)*(char *)((long)&parsing_float_float_tests + lVar10) != _Var6) {
        greatest_info.fail_line = 0x109;
        greatest_info.msg = "float_tests[i].expect_success != success";
        greatest_info.assertions = greatest_info.assertions + 1;
LAB_00102fb9:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parsing-utils.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_001032e0;
        iVar8 = -1;
        goto LAB_00102fd0;
      }
      uVar11 = greatest_info.assertions + 1;
      if (_Var6) {
        dVar12 = (double)local_30._0_4_;
        greatest_info.assertions = greatest_info.assertions + 2;
        if ((((float)local_38 < local_30._0_4_) &&
            (9.999999747378752e-05 < dVar12 - (double)(float)local_38)) ||
           ((uVar11 = greatest_info.assertions, local_30._0_4_ < (float)local_38 &&
            (9.999999747378752e-05 < (double)(float)local_38 - dVar12)))) {
          fprintf(_stdout,"\nExpected: %g +/- %g\n     Got: %g\n",dVar12,0x3f1a36e2e0000000);
          greatest_info.fail_line = 0x10b;
          greatest_info.msg = "expected != obtained +/- EPSILON";
          goto LAB_00102fb9;
        }
      }
      greatest_info.assertions = uVar11;
    }
    greatest_info.msg = (char *)0x0;
    iVar8 = 0;
LAB_00102fd0:
    greatest_test_post(iVar8);
  }
  iVar8 = greatest_test_pre("parsing_double");
  if (iVar8 == 1) {
    for (lVar10 = 0x10; lVar10 != 0x538; lVar10 = lVar10 + 0x18) {
      local_30 = *(double *)(&UNK_001064d8 + lVar10);
      _Var6 = str_to_double(*(char **)(&UNK_001064d0 + lVar10),(double *)&local_38);
      if ((_Bool)*(char *)((long)&parsing_double_double_tests + lVar10) != _Var6) {
        greatest_info.fail_line = 0x16e;
        greatest_info.msg = "double_tests[i].expect_success != success";
        greatest_info.assertions = greatest_info.assertions + 1;
LAB_001030f1:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parsing-utils.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_001032e0;
        iVar8 = -1;
        goto LAB_00103108;
      }
      uVar11 = greatest_info.assertions + 1;
      if (_Var6) {
        dVar12 = (double)CONCAT44(local_38._4_4_,(float)local_38);
        greatest_info.assertions = greatest_info.assertions + 2;
        if (((dVar12 < local_30) && (9.999999747378752e-05 < local_30 - dVar12)) ||
           ((uVar11 = greatest_info.assertions, local_30 < dVar12 &&
            (9.999999747378752e-05 < dVar12 - local_30)))) {
          fprintf(_stdout,"\nExpected: %g +/- %g\n     Got: %g\n",local_30,0x3f1a36e2e0000000);
          greatest_info.fail_line = 0x170;
          greatest_info.msg = "expected != obtained +/- EPSILON";
          goto LAB_001030f1;
        }
      }
      greatest_info.assertions = uVar11;
    }
    greatest_info.msg = (char *)0x0;
    iVar8 = 0;
LAB_00103108:
    greatest_test_post(iVar8);
  }
  iVar8 = greatest_test_pre("parsing_usize");
  if (iVar8 == 1) {
    for (lVar10 = 0x10; lVar10 != 0x298; lVar10 = lVar10 + 0x18) {
      lVar4 = *(long *)(&UNK_00106a08 + lVar10);
      _Var6 = str_to_usize(*(char **)(&UNK_00106a00 + lVar10),&local_38);
      if ((_Bool)*(char *)((long)&parsing_usize_usize_tests + lVar10) != _Var6) {
        greatest_info.fail_line = 0xa4;
        greatest_info.msg = "usize_tests[i].expect_success != success";
        greatest_info.assertions = greatest_info.assertions + 1;
LAB_001031c5:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parsing-utils.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_001032e0;
        iVar8 = -1;
        goto LAB_001031dc;
      }
      uVar11 = greatest_info.assertions + 1;
      if ((_Var6) &&
         (uVar11 = greatest_info.assertions + 2, lVar4 != CONCAT44(local_38._4_4_,(float)local_38)))
      {
        greatest_info.fail_line = 0xa6;
        greatest_info.msg = "expected != obtained";
        greatest_info.assertions = greatest_info.assertions + 2;
        goto LAB_001031c5;
      }
      greatest_info.assertions = uVar11;
    }
    greatest_info.msg = (char *)0x0;
    iVar8 = 0;
LAB_001031dc:
    greatest_test_post(iVar8);
  }
  iVar8 = greatest_test_pre("parsing_bool");
  if (iVar8 == 1) {
    iVar8 = -1;
    for (lVar10 = 9; lVar10 != 0x139; lVar10 = lVar10 + 0x10) {
      cVar2 = (&UNK_00106c9f)[lVar10];
      _Var6 = str_to_bool(*(char **)(&UNK_00106c97 + lVar10),(_Bool *)&local_38);
      if ((_Bool)*(char *)((long)&parsing_bool_bool_tests + lVar10) != _Var6) {
        greatest_info.fail_line = 0x1aa;
        greatest_info.msg = "bool_tests[i].expect_success != success";
        greatest_info.assertions = greatest_info.assertions + 1;
LAB_0010329c:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parsing-utils.c"
        ;
        if ((greatest_info.flags & 4) != 0) {
LAB_001032e0:
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parsing-utils.c"
          ;
          abort();
        }
        goto LAB_001032ac;
      }
      uVar11 = greatest_info.assertions + 1;
      if (_Var6) {
        uVar11 = greatest_info.assertions + 2;
        if ((_Bool)cVar2 != local_38._0_1_) {
          greatest_info.fail_line = 0x1ac;
          greatest_info.msg = "expected != obtained";
          greatest_info.assertions = greatest_info.assertions + 2;
          goto LAB_0010329c;
        }
      }
      greatest_info.assertions = uVar11;
    }
    greatest_info.msg = (char *)0x0;
    iVar8 = 0;
LAB_001032ac:
    greatest_test_post(iVar8);
  }
  GREATEST_PRINT_REPORT();
  return (int)(greatest_info.failed != 0);
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(parsing_int32);
    RUN_TEST(parsing_float);
    RUN_TEST(parsing_double);
    RUN_TEST(parsing_usize);
    RUN_TEST(parsing_bool);

    GREATEST_MAIN_END(); /* display results */
}